

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  uint uVar2;
  Posf *pPVar3;
  Posf *pPVar4;
  ulong uVar5;
  uInt uVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  uInt uVar10;
  IPos cur_match;
  Bytef *pBVar11;
  uint uVar12;
  uInt uVar13;
  bool bVar14;
  bool bVar15;
  
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        return need_more;
      }
      if (s->lookahead == 0) {
        uVar12 = s->strstart;
        uVar9 = 2;
        if (uVar12 < 2) {
          uVar9 = uVar12;
        }
        s->insert = uVar9;
        if (flush != 4) {
          if (s->sym_next != 0) {
            uVar5 = s->block_start;
            if ((long)uVar5 < 0) {
              pBVar11 = (Bytef *)0x0;
            }
            else {
              pBVar11 = s->window + (uVar5 & 0xffffffff);
            }
            cm_zlib__tr_flush_block(s,(charf *)pBVar11,uVar12 - uVar5,0);
            s->block_start = (ulong)s->strstart;
            flush_pending(s->strm);
            if (s->strm->avail_out == 0) {
              return need_more;
            }
          }
          return block_done;
        }
        uVar5 = s->block_start;
        if ((long)uVar5 < 0) {
          pBVar11 = (Bytef *)0x0;
        }
        else {
          pBVar11 = s->window + (uVar5 & 0xffffffff);
        }
        cm_zlib__tr_flush_block(s,(charf *)pBVar11,uVar12 - uVar5,1);
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        return finish_done - (s->strm->avail_out == 0);
      }
    }
    cur_match = 0;
    if (2 < s->lookahead) {
      uVar12 = s->strstart;
      uVar9 = ((uint)s->window[uVar12 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
              s->hash_mask;
      s->ins_h = uVar9;
      pPVar3 = s->head;
      uVar1 = pPVar3[uVar9];
      cur_match = (IPos)uVar1;
      s->prev[s->w_mask & uVar12] = uVar1;
      pPVar3[uVar9] = (Posf)uVar12;
    }
    if ((cur_match != 0) && (s->strstart - cur_match <= s->w_size - 0x106)) {
      uVar6 = longest_match(s,cur_match);
      s->match_length = uVar6;
    }
    if (s->match_length < 3) {
      bVar8 = s->window[s->strstart];
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = '\0';
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = '\0';
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = bVar8;
      s->dyn_ltree[bVar8].fc.freq = s->dyn_ltree[bVar8].fc.freq + 1;
      bVar15 = s->sym_next == s->sym_end;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar8 = (char)s->match_length - 3;
      iVar7 = s->strstart - s->match_start;
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = (uchf)iVar7;
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = (uchf)((uint)iVar7 >> 8);
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = bVar8;
      s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq + 1;
      uVar9 = iVar7 - 1U & 0xffff;
      uVar12 = (uVar9 >> 7) + 0x100;
      if (uVar9 < 0x100) {
        uVar12 = iVar7 - 1U;
      }
      s->dyn_dtree[""[uVar12 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar12 & 0xffff]].fc.freq + 1;
      bVar15 = s->sym_next == s->sym_end;
      uVar12 = s->match_length;
      uVar9 = s->lookahead - uVar12;
      s->lookahead = uVar9;
      if (uVar9 < 3 || s->max_lazy_match < uVar12) {
        uVar6 = s->strstart;
        uVar9 = uVar6 + uVar12;
        s->strstart = uVar9;
        s->match_length = 0;
        uVar9 = (uint)s->window[uVar9];
        s->ins_h = uVar9;
        s->ins_h = ((uint)s->window[uVar6 + uVar12 + 1] ^ uVar9 << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
      }
      else {
        s->match_length = uVar12 - 1;
        uVar6 = s->hash_shift;
        pBVar11 = s->window;
        uVar9 = s->hash_mask;
        pPVar3 = s->head;
        pPVar4 = s->prev;
        uVar2 = s->w_mask;
        uVar13 = s->ins_h;
        uVar10 = uVar12 - 2;
        uVar12 = s->strstart + 1;
        do {
          s->strstart = uVar12;
          uVar13 = ((uint)pBVar11[uVar12 + 2] ^ uVar13 << ((byte)uVar6 & 0x1f)) & uVar9;
          s->ins_h = uVar13;
          pPVar4[uVar2 & uVar12] = pPVar3[uVar13];
          pPVar3[uVar13] = (Posf)uVar12;
          s->match_length = uVar10;
          uVar12 = uVar12 + 1;
          bVar14 = uVar10 != 0;
          uVar10 = uVar10 - 1;
        } while (bVar14);
        s->strstart = uVar12;
      }
    }
    if (bVar15) {
      uVar5 = s->block_start;
      if ((long)uVar5 < 0) {
        pBVar11 = (Bytef *)0x0;
      }
      else {
        pBVar11 = s->window + (uVar5 & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)pBVar11,s->strstart - uVar5,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head;       /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < MIN_MATCH-1 ? s->strstart : MIN_MATCH-1;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}